

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ComputeInvocationsTestInstance *this)

{
  VkDescriptorSet destSet;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)16>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  deUint32 dVar1;
  DeviceInterface *vk_00;
  VkDevice device_00;
  size_type sVar2;
  const_reference parm;
  VkPhysicalDeviceProperties *pVVar3;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *this_00;
  Handle<(vk::HandleType)19> *descriptorSetLayout_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar4;
  Buffer *this_02;
  Handle<(vk::HandleType)22> *pHVar5;
  DescriptorSetUpdateBuilder *this_03;
  Handle<(vk::HandleType)24> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  SharedPtr<vkt::Draw::Buffer> local_3b8;
  deUint64 local_3a8;
  Move<vk::Handle<(vk::HandleType)24>_> local_3a0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_380;
  undefined1 local_360 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  DescriptorSetUpdateBuilder local_318;
  undefined1 local_2d0 [8];
  VkDescriptorBufferInfo descriptorInfo;
  RefData<vk::Handle<(vk::HandleType)22>_> local_298;
  undefined1 local_278 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  VkDescriptorSetAllocateInfo allocateParams;
  Move<vk::Handle<(vk::HandleType)21>_> local_218;
  RefData<vk::Handle<(vk::HandleType)21>_> local_1f8;
  undefined1 local_1d8 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  RefData<vk::Handle<(vk::HandleType)16>_> local_198;
  undefined1 local_178 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)19>_> local_110;
  RefData<vk::Handle<(vk::HandleType)19>_> local_f0;
  undefined1 local_d0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  BufferCreateInfo local_a0;
  undefined1 local_50 [8];
  SharedPtr<vkt::Draw::Buffer> buffer;
  VkDeviceSize bufferSizeBytes;
  size_t parametersNdx;
  deUint32 maxSize;
  VkDevice device;
  DeviceInterface *vk;
  ComputeInvocationsTestInstance *this_local;
  
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])();
  vk_00 = Context::getDeviceInterface
                    ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.
                                 m_context);
  parametersNdx._4_4_ = 0;
  bufferSizeBytes = 0;
  while( true ) {
    sVar2 = std::
            vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            ::size(this->m_parameters);
    if (sVar2 <= bufferSizeBytes) break;
    parm = std::
           vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
           ::operator[](this->m_parameters,bufferSizeBytes);
    dVar1 = getComputeExecution(this,parm);
    parametersNdx._4_4_ = deMaxu32(parametersNdx._4_4_,dVar1);
    bufferSizeBytes = bufferSizeBytes + 1;
  }
  pVVar3 = Context::getDeviceProperties
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  buffer.m_state =
       (SharedPtrStateBase *)
       deAlignSize((ulong)parametersNdx._4_4_ << 2,(pVVar3->limits).nonCoherentAtomSize);
  Draw::BufferCreateInfo::BufferCreateInfo
            (&local_a0,(VkDeviceSize)buffer.m_state,0x20,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0
             ,0);
  allocator = Context::getDefaultAllocator
                        ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _0_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_50,vk_00,device_00,&local_a0.super_VkBufferCreateInfo,allocator,
             ::vk::MemoryRequirement::HostVisible);
  Draw::BufferCreateInfo::~BufferCreateInfo(&local_a0);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_110,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f0,(Move *)&local_110);
  data.deleter.m_deviceIface = local_f0.deleter.m_deviceIface;
  data.object.m_internal = local_f0.object.m_internal;
  data.deleter.m_device = local_f0.deleter.m_device;
  data.deleter.m_allocator = local_f0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_d0,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_110);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator);
  descriptorSetLayout_00 =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)
                     &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator,vk_00,device_00,descriptorSetLayout_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_198,
             (Move *)&descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface = local_198.deleter.m_deviceIface;
  data_00.object.m_internal = local_198.object.m_internal;
  data_00.deleter.m_device = local_198.deleter.m_device;
  data_00.deleter.m_allocator = local_198.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_178,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&allocateParams.pSetLayouts);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&allocateParams.pSetLayouts,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_218,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)&local_218);
  data_01.deleter.m_deviceIface = local_1f8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1f8.object.m_internal;
  data_01.deleter.m_device = local_1f8.deleter.m_device;
  data_01.deleter.m_allocator = local_1f8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_1d8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_218);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)&allocateParams.pSetLayouts);
  descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal.
  _0_4_ = 0x22;
  allocateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateParams._4_4_ = 0;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_1d8);
  allocateParams.pNext = (void *)pHVar4->m_internal;
  allocateParams.descriptorPool.m_internal._0_4_ = 1;
  allocateParams._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorInfo.range,vk_00,device_00,
             (VkDescriptorSetAllocateInfo *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_298,(Move *)&descriptorInfo.range);
  data_02.deleter.m_deviceIface = local_298.deleter.m_deviceIface;
  data_02.object.m_internal = local_298.object.m_internal;
  data_02.deleter.m_device = local_298.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_298.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_278,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorInfo.range);
  this_02 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)local_50);
  local_2d0 = (undefined1  [8])Draw::Buffer::object(this_02);
  descriptorInfo.buffer.m_internal = 0;
  descriptorInfo.offset = (VkDeviceSize)buffer.m_state;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_318);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_278);
  destSet.m_internal = pHVar5->m_internal;
  cmdPoolCreateInfo.super_VkCommandPoolCreateInfo._16_8_ =
       ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_03 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_318,destSet,
                       (Location *)&cmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(VkDescriptorBufferInfo *)local_2d0);
  ::vk::DescriptorSetUpdateBuilder::update(this_03,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_318);
  dVar1 = Context::getUniversalQueueFamilyIndex
                    ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             dVar1,2);
  ::vk::createCommandPool
            (&local_3a0,vk_00,device_00,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_380,(Move *)&local_3a0);
  data_03.deleter.m_deviceIface = local_380.deleter.m_deviceIface;
  data_03.object.m_internal = local_380.object.m_internal;
  data_03.deleter.m_device = local_380.deleter.m_device;
  data_03.deleter.m_allocator = local_380.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_360,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_3a0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_360);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_178);
  local_3a8 = pHVar7->m_internal;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_278);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&local_3b8,(SharedPtr<vkt::Draw::Buffer> *)local_50);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])
            (__return_storage_ptr__,this,pHVar6,local_3a8,pHVar5,&local_3b8,(int)buffer.m_state);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_3b8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_360);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_278);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_1d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_178);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_d0);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_50);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	ComputeInvocationsTestInstance::iterate (void)
{
	checkExtensions();
	const DeviceInterface&				vk						= m_context.getDeviceInterface();
	const VkDevice						device					= m_context.getDevice();
	deUint32							maxSize					= 0u;

	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		maxSize = deMaxu32(maxSize, getComputeExecution(m_parameters[parametersNdx]));

	const VkDeviceSize					bufferSizeBytes			= static_cast<VkDeviceSize>(deAlignSize(static_cast<size_t>(sizeof(deUint32) * maxSize),
																								static_cast<size_t>(m_context.getDeviceProperties().limits.nonCoherentAtomSize)));
	de::SharedPtr<Buffer>				buffer					= Buffer::createAndAlloc(vk, device, BufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
																							 m_context.getDefaultAllocator(), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout>	descriptorSetLayout		(DescriptorSetLayoutBuilder()
			.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
			.build(vk, device));

	const Unique<VkPipelineLayout>		pipelineLayout			(makePipelineLayout(vk, device, &(*descriptorSetLayout)));

	const Unique<VkDescriptorPool>		descriptorPool			(DescriptorPoolBuilder()
			.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
			.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const VkDescriptorSetAllocateInfo allocateParams		=
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,	// VkStructureType				sType;
		DE_NULL,										// const void*					pNext;
		*descriptorPool,								// VkDescriptorPool				descriptorPool;
		1u,												// deUint32						setLayoutCount;
		&(*descriptorSetLayout),						// const VkDescriptorSetLayout*	pSetLayouts;
	};

	const Unique<VkDescriptorSet>		descriptorSet		(allocateDescriptorSet(vk, device, &allocateParams));
	const VkDescriptorBufferInfo		descriptorInfo		=
	{
		buffer->object(),	//VkBuffer		buffer;
		0ull,				//VkDeviceSize	offset;
		bufferSizeBytes,	//VkDeviceSize	range;
	};

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo)
		.update(vk, device);

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, &cmdPoolCreateInfo));

	return executeTest (*cmdPool, *pipelineLayout, *descriptorSet, buffer, bufferSizeBytes);
}